

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void computeJD(DateTime *p)

{
  int iVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  uint uVar5;
  ushort uVar6;
  int iVar7;
  
  if (p->validJD == '\0') {
    if (p->validYMD == '\0') {
      iVar7 = 1;
      iVar4 = 2000;
      iVar2 = iVar7;
    }
    else {
      iVar4 = p->Y;
      if (iVar4 - 10000U < 0xffffc687) goto LAB_00189b05;
      iVar7 = p->D;
      iVar2 = p->M;
    }
    if (p->rawS != '\0') {
LAB_00189b05:
      p->s = 0.0;
      p->validJD = '\0';
      p->rawS = '\0';
      p->validYMD = '\0';
      p->validHMS = '\0';
      p->validTZ = '\0';
      p->tzSet = '\0';
      p->isError = '\0';
      p->field_0x2f = 0;
      p->D = 0;
      p->h = 0;
      p->m = 0;
      p->tz = 0;
      p->iJD = 0;
      p->Y = 0;
      p->M = 0;
      p->isError = '\x01';
      return;
    }
    iVar1 = iVar2 + 0xc;
    if (2 < iVar2) {
      iVar1 = iVar2;
    }
    uVar5 = iVar4 - (uint)(iVar2 < 3);
    uVar6 = (short)uVar5 >> 0xf;
    lVar3 = (long)(((double)(int)((uVar5 * 0x8ead + 0xa445afc) / 100 +
                                  (int)(short)((int)((uint)uVar6 << 0x10 | uVar5 & 0xffff) / 400) +
                                  (iVar1 * 0x4ab51 + 0x4ab51) / 10000 + iVar7 +
                                 (int)(short)((short)((int)((uint)uVar6 << 0x10 | uVar5 & 0xffff) /
                                                     -100) + 2)) + -1524.5) * 86400000.0);
    p->iJD = lVar3;
    p->validJD = '\x01';
    if (p->validHMS != '\0') {
      lVar3 = (long)(p->s * 1000.0) + (long)p->m * 60000 + (long)p->h * 3600000 + lVar3;
      p->iJD = lVar3;
      if (p->validTZ != '\0') {
        p->iJD = lVar3 + (long)p->tz * -60000;
        p->validYMD = '\0';
        p->validHMS = '\0';
        p->validTZ = '\0';
        return;
      }
    }
  }
  return;
}

Assistant:

static void computeJD(DateTime *p){
  int Y, M, D, A, B, X1, X2;

  if( p->validJD ) return;
  if( p->validYMD ){
    Y = p->Y;
    M = p->M;
    D = p->D;
  }else{
    Y = 2000;  /* If no YMD specified, assume 2000-Jan-01 */
    M = 1;
    D = 1;
  }
  if( Y<-4713 || Y>9999 || p->rawS ){
    datetimeError(p);
    return;
  }
  if( M<=2 ){
    Y--;
    M += 12;
  }
  A = Y/100;
  B = 2 - A + (A/4);
  X1 = 36525*(Y+4716)/100;
  X2 = 306001*(M+1)/10000;
  p->iJD = (sqlite3_int64)((X1 + X2 + D + B - 1524.5 ) * 86400000);
  p->validJD = 1;
  if( p->validHMS ){
    p->iJD += p->h*3600000 + p->m*60000 + (sqlite3_int64)(p->s*1000);
    if( p->validTZ ){
      p->iJD -= p->tz*60000;
      p->validYMD = 0;
      p->validHMS = 0;
      p->validTZ = 0;
    }
  }
}